

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filter-ex.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  reference pvVar6;
  long in_RSI;
  int in_EDI;
  Mat frame;
  int q;
  int i;
  VideoCapture cap;
  ostream *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe70;
  allocator local_119;
  string local_118 [56];
  Mat local_e0 [100];
  int local_7c;
  int local_78;
  allocator local_61;
  string local_60 [32];
  _OutputArray local_40 [2];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ac::init();
  if (local_8 != 2) {
    std::operator<<((ostream *)&std::cerr,"Error requires file argument..\n");
    exit(1);
  }
  pcVar1 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar1,&local_61);
  cv::VideoCapture::VideoCapture((VideoCapture *)local_40,local_60,0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar2 = cv::VideoCapture::isOpened();
  if ((bVar2 & 1) == 0) {
    std::operator<<((ostream *)&std::cerr,"Error capture device not opened..\n");
    exit(1);
  }
  local_78 = 0;
  while( true ) {
    iVar4 = local_78;
    iVar3 = ac::getFilterCount();
    if (iVar3 <= iVar4) break;
    for (local_7c = 0; local_7c < 0x1e; local_7c = local_7c + 1) {
      cv::Mat::Mat(local_e0);
      cv::_OutputArray::_OutputArray
                ((_OutputArray *)in_stack_fffffffffffffe70,(Mat *)in_stack_fffffffffffffe68);
      bVar2 = cv::VideoCapture::read(local_40);
      cv::_OutputArray::~_OutputArray((_OutputArray *)0x1024bc);
      if ((bVar2 & 1) == 0) {
        pcVar1 = *(char **)(local_10 + 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,pcVar1,&local_119);
        cv::VideoCapture::open((string *)local_40,(int)local_118);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"[");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_78);
        poVar5 = std::operator<<(poVar5,"/");
        iVar4 = ac::getFilterCount();
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
        poVar5 = std::operator<<(poVar5,"] - calling.. ");
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&ac::draw_strings_abi_cxx11_,(long)local_78);
        poVar5 = std::operator<<(poVar5,(string *)pvVar6);
        std::operator<<(poVar5,"\n");
        ac::CallFilter(local_78,local_e0);
        in_stack_fffffffffffffe70 = std::operator<<((ostream *)&std::cout,"call complete [");
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&ac::draw_strings_abi_cxx11_,(long)local_78);
        in_stack_fffffffffffffe68 = std::operator<<(in_stack_fffffffffffffe70,(string *)pvVar6);
        std::operator<<(in_stack_fffffffffffffe68,"]\n");
      }
      cv::Mat::~Mat(local_e0);
    }
    local_78 = local_78 + 1;
  }
  local_4 = 0;
  cv::VideoCapture::~VideoCapture((VideoCapture *)local_40);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    
    ac::init();
    
    if(argc != 2) {
        std::cerr << "Error requires file argument..\n";
        exit(EXIT_FAILURE);
    }
    cv::VideoCapture cap(argv[1]);
    if(!cap.isOpened()) {
        std::cerr << "Error capture device not opened..\n";
        exit(EXIT_FAILURE);
    }
    for(int i = 0; i < ac::getFilterCount(); ++i) {
        
        //	if( ac::draw_strings[i].find("Shuffle") != std::string::npos ||  ac::draw_strings[i].find("Rand") != std::string::npos ||  ac::draw_strings[i].find("Frame") != std::string::npos )
        //		continue;
        
        //		if(ac::draw_strings[i].find("Random") != std::string::npos)
        //			continue;
        
        for(int q = 0; q < 30; ++q) {
            cv::Mat frame;
            if(cap.read(frame)) {
                std::cout << "[" << i << "/" << ac::getFilterCount() << "] - calling.. " << ac::draw_strings[i] << "\n";
                ac::CallFilter(i, frame);
                std::cout << "call complete [" << ac::draw_strings[i] << "]\n";
            } else {
                cap.open(argv[1]);
            }
        }
    }
    return 0;
}